

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadLght_Binary
          (COBImporter *this,Scene *out,StreamReaderLE *reader,ChunkInfo *nfo)

{
  Node *msh;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Light *__p;
  _Elt_pointer psVar4;
  ChunkInfo *pCVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  chunk_guard cn;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  chunk_guard local_50;
  shared_ptr<Assimp::COB::Node> local_38;
  
  if (2 < nfo->version) {
    UnsupportedChunk_Binary(this,reader,nfo,"Lght");
    return;
  }
  local_50.cur = (long)(*(int *)&reader->current - *(int *)&reader->buffer);
  pCVar5 = nfo;
  local_50.nfo = nfo;
  local_50.reader = reader;
  __p = (Light *)operator_new(0xf0);
  COB::Node::Node((Node *)__p,TYPE_LIGHT);
  (__p->super_Node)._vptr_Node = (_func_int **)&PTR__Node_008cabe0;
  *(undefined8 *)&(__p->super_Node).field_0xd4 = 0;
  *(undefined8 *)&__p->field_0xdc = 0;
  __p->inner_angle = 0.0;
  __p->ltype = SPOT;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::COB::Light*>
            (a_Stack_60,__p);
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_60[0]._M_pi;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__p;
  std::deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
  ::emplace_back<std::shared_ptr<Assimp::COB::Node>>
            ((deque<std::shared_ptr<Assimp::COB::Node>,std::allocator<std::shared_ptr<Assimp::COB::Node>>>
              *)out,&local_38);
  if (local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  this_00._M_pi = a_Stack_60[0]._M_pi;
  if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
  }
  psVar4 = (out->nodes).
           super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar4 == (out->nodes).
                super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pCVar5 = (ChunkInfo *)
             (out->nodes).
             super__Deque_base<std::shared_ptr<Assimp::COB::Node>,_std::allocator<std::shared_ptr<Assimp::COB::Node>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node;
    psVar4 = (_Elt_pointer)(*(long *)&pCVar5[-1].version + 0x200);
  }
  msh = psVar4[-1].super___shared_ptr<Assimp::COB::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = nfo->parent_id;
  uVar2 = nfo->version;
  uVar3 = nfo->size;
  (msh->super_ChunkInfo).id = nfo->id;
  (msh->super_ChunkInfo).parent_id = uVar1;
  (msh->super_ChunkInfo).version = uVar2;
  (msh->super_ChunkInfo).size = uVar3;
  ReadBasicNodeInfo_Binary((COBImporter *)this_00._M_pi,msh,reader,pCVar5);
  chunk_guard::~chunk_guard(&local_50);
  return;
}

Assistant:

void COBImporter::ReadLght_Binary(COB::Scene& out, StreamReaderLE& reader, const ChunkInfo& nfo)
{
    if(nfo.version > 2) {
        return UnsupportedChunk_Binary(reader,nfo,"Lght");
    }

    const chunk_guard cn(nfo,reader);

    out.nodes.push_back(std::shared_ptr<Light>(new Light()));
    Light& msh = (Light&)(*out.nodes.back().get());
    msh = nfo;

    ReadBasicNodeInfo_Binary(msh,reader,nfo);
}